

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v6::print<char[28],char_const*&,int&,char_const*&,char>
               (FILE *f,char (*format_str) [28],char **args,int *args_1,char **args_2)

{
  format_args *in_RDI;
  FILE *in_stack_000001f0;
  undefined1 in_stack_000001f8 [16];
  string_view in_stack_00000208;
  format_arg_store<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>,_const_char_*,_int,_const_char_*>
  *in_stack_ffffffffffffff78;
  remove_reference_t<const_char_*&> *in_stack_ffffffffffffff88;
  remove_reference_t<int_&> *in_stack_ffffffffffffff90;
  remove_reference_t<const_char_*&> *in_stack_ffffffffffffff98;
  char (*in_stack_ffffffffffffffa0) [28];
  
  to_string_view<char,_0>((char *)0x1b61da);
  internal::make_args_checked<char_const*&,int&,char_const*&,char[28],char>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  format_args::
  format_args<fmt::v6::format_arg_store<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>,char_const*,int,char_const*>>
            (in_RDI,in_stack_ffffffffffffff78);
  vprint(in_stack_000001f0,in_stack_00000208,(format_args)in_stack_000001f8);
  return;
}

Assistant:

inline void print(std::FILE* f, const S& format_str, Args&&... args) {
  return internal::is_unicode<Char>()
             ? vprint(f, to_string_view(format_str),
                      internal::make_args_checked<Args...>(format_str, args...))
             : internal::vprint_mojibake(
                   f, to_string_view(format_str),
                   internal::make_args_checked<Args...>(format_str, args...));
}